

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void do_const_prop(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  virtual_insn *insn;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int mov_src;
  void *info_ptr;
  basic_block_conflict info_ptr_00;
  int in_R8D;
  virtual_insn *pvVar6;
  virtual_insn *i;
  long lVar7;
  
  lVar7 = (long)loc;
  insn = insns + lVar7;
  if (insns[lVar7].class_code == '\t') {
    uVar1 = (insn->opnds).a3.src1;
    info_ptr_00 = (basic_block_conflict)(ulong)uVar1;
    iVar3 = has_single_def_use(c,uVar1);
    if (iVar3 != 0) {
      iVar3 = (insn->opnds).a3.dest;
      if (c->dill_debug != 0) {
        printf(" mov propagating    ");
        virtual_print_insn(c,info_ptr_00,insn);
        putchar(10);
      }
      bVar2 = true;
      pvVar6 = insns + lVar7;
      while( true ) {
        lVar7 = lVar7 + -1;
        i = pvVar6 + -1;
        if ((!bVar2) || (lVar7 <= bb->start)) break;
        bVar2 = true;
        switch(i->class_code) {
        case '\0':
        case '\x01':
        case '\x02':
        case '\x04':
        case '\t':
          if (pvVar6[-1].opnds.a3.dest == uVar1) {
            if (c->dill_debug != 0) {
              printf("   Replacing  ");
              virtual_print_insn(c,info_ptr_00,i);
              printf(" with ");
            }
            pvVar6[-1].opnds.a3.dest = iVar3;
LAB_00110867:
            if (c->dill_debug != 0) {
              virtual_print_insn(c,info_ptr_00,i);
              putchar(10);
            }
            insn->class_code = '\x18';
            info_ptr_00 = bb;
            set_unused(c,bb,uVar1);
            bVar2 = false;
          }
          break;
        case '\x05':
          if (((pvVar6[-1].insn_code & 0x10U) == 0) && (pvVar6[-1].opnds.a3.dest == uVar1)) {
            if (c->dill_debug != 0) {
              printf("   Replacing  ");
              virtual_print_insn(c,info_ptr_00,i);
              printf(" with ");
            }
            pvVar6[-1].opnds.a3.dest = uVar1;
            goto LAB_00110867;
          }
        }
        pvVar6 = i;
      }
    }
  }
  else if (insns[lVar7].class_code == '\a') {
    uVar1 = (insn->opnds).a3.dest;
    info_ptr = (void *)(ulong)uVar1;
    iVar3 = has_single_def_use(c,uVar1);
    if (iVar3 == 0) {
      iVar3 = insn_defines(insn);
      if (c->dill_debug != 0) {
        printf(" Forward propagating const    ");
        virtual_print_insn(c,info_ptr,insn);
        putchar(10);
      }
      pvVar6 = insns + lVar7;
      while( true ) {
        pvVar6 = pvVar6 + 1;
        lVar5 = bb->end;
        if (lVar5 <= lVar7) break;
        iVar4 = insn_defines(pvVar6);
        if (iVar3 == iVar4) {
          lVar5 = bb->end;
          break;
        }
        const_prop_ip(c,bb,pvVar6,insn,in_R8D);
        lVar7 = lVar7 + 1;
      }
      if (lVar7 < lVar5) {
        const_prop_ip(c,bb,pvVar6,insn,in_R8D);
        return;
      }
    }
    else {
      if (c->dill_debug != 0) {
        printf(" Forward propagating    ");
        virtual_print_insn(c,info_ptr,insn);
        putchar(10);
      }
      pvVar6 = insns + lVar7;
      iVar3 = 0;
      while ((pvVar6 = pvVar6 + 1, lVar7 < bb->end && (iVar3 == 0))) {
        lVar7 = lVar7 + 1;
        iVar3 = const_prop_ip(c,bb,pvVar6,insn,in_R8D);
      }
    }
  }
  return;
}

Assistant:

static void
do_const_prop(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* set_ip = &((virtual_insn*)insns)[loc];
    if ((set_ip->class_code == iclass_set) &&
        has_single_def_use(c, set_ip->opnds.a3i.dest)) {
        int found = 0;
        int k;

        if (c->dill_debug) {
            printf(" Forward propagating    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc + 1; ((k <= bb->end) && (!found)); k++) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            found = const_prop_ip(c, bb, ip, set_ip, 1);
        }
    } else if (set_ip->class_code == iclass_set) {
        int k;
        int vdest = insn_defines(set_ip);
        if (c->dill_debug) {
            printf(" Forward propagating const    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc + 1; ((k <= bb->end) &&
                           (vdest != insn_defines(&((virtual_insn*)insns)[k])));
             k++) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            const_prop_ip(c, bb, ip, set_ip, 0);
        }
        if (k <= bb->end) {
            /* if we ended in insn_defines, substitute the one that defines it
             */
            const_prop_ip(c, bb, &((virtual_insn*)insns)[k], set_ip, 0);
        }
    } else if (((set_ip->class_code == iclass_mov) ||
                ((set_ip->class_code == iclass_convert) &&
                 is_convert_noop(set_ip->insn_code))) &&
               has_single_def_use(c, set_ip->opnds.a2.src)) {
        /* back propagate move */
        int mov_src = set_ip->opnds.a2.src;
        int mov_dest = set_ip->opnds.a2.dest;
        int found = 0;
        int k;

        if (c->dill_debug) {
            printf(" mov propagating    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc - 1; ((k > bb->start) && (!found)); k--) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            switch (ip->class_code) {
            case iclass_arith3: {
                /* arith 3 operand integer insns */
                int dest_vreg = ip->opnds.a3.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_arith2: {
                /* arith 2 operand integer insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
                break;
            }
            case iclass_arith3i: {
                /* arith 3 immediate operand integer insns */
                int dest_vreg = ip->opnds.a3i.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_ret:
                break;
            case iclass_convert: {
                /* conversion insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_loadstore: {
                int store = ((ip->insn_code & 0x10) == 0x10);
                /* load/store 3 operand integer insns */
                int dest_vreg = ip->opnds.a3.dest;

                if (!store && (dest_vreg == mov_src)) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_src;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_loadstorei:
                break;
            case iclass_lea:
                break;
            case iclass_set:
                break;
            case iclass_setf:
                break;
            case iclass_mov: {
                /* mov insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_reti:
            case iclass_branch:
            case iclass_branchi:
            case iclass_compare:
            case iclass_jump_to_label:
            case iclass_jump_to_reg:
            case iclass_jump_to_imm:
            case iclass_special:
            case iclass_call:
            case iclass_push:
            case iclass_pushi:
            case iclass_pushf:
            case iclass_nop:
            case iclass_mark_label:
                break;
            }
        }
    }
}